

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     Combine<duckdb::ArgMinMaxState<double,int>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  char cVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  char *pcVar4;
  char *pcVar5;
  idx_t iVar6;
  
  if (count != 0) {
    pdVar2 = source->data;
    pdVar3 = target->data;
    iVar6 = 0;
    do {
      pcVar4 = *(char **)(pdVar2 + iVar6 * 8);
      if ((*pcVar4 == '\x01') &&
         ((pcVar5 = *(char **)(pdVar3 + iVar6 * 8), *pcVar5 != '\x01' ||
          (*(int *)(pcVar4 + 0x10) < *(int *)(pcVar5 + 0x10))))) {
        cVar1 = pcVar4[1];
        pcVar5[1] = cVar1;
        if (cVar1 == '\0') {
          *(undefined8 *)(pcVar5 + 8) = *(undefined8 *)(pcVar4 + 8);
        }
        *(undefined4 *)(pcVar5 + 0x10) = *(undefined4 *)(pcVar4 + 0x10);
        *pcVar5 = '\x01';
      }
      iVar6 = iVar6 + 1;
    } while (count != iVar6);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}